

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_world(void)

{
  level_map_conflict *plVar1;
  level_conflict *plVar2;
  store *psVar3;
  long lVar4;
  store *store;
  long lVar5;
  level_map_conflict **pplVar6;
  
  pplVar6 = &maps;
  while (plVar1 = *pplVar6, plVar1 != (level_map_conflict *)0x0) {
    lVar4 = 0x40;
    for (lVar5 = 0; lVar5 < plVar1->num_levels; lVar5 = lVar5 + 1) {
      plVar2 = plVar1->levels;
      string_free(*(char **)((long)plVar2 + lVar4 + -0x28));
      string_free(*(char **)((long)plVar2 + lVar4 + -0x20));
      string_free(*(char **)((long)plVar2 + lVar4 + -0x18));
      string_free(*(char **)((long)plVar2 + lVar4 + -0x10));
      string_free(*(char **)((long)plVar2 + lVar4 + -8));
      string_free(*(char **)((long)&plVar2->index + lVar4));
      lVar4 = lVar4 + 0x50;
    }
    for (lVar4 = 0; lVar4 < plVar1->num_towns; lVar4 = lVar4 + 1) {
      store = plVar1->towns[lVar4].stores;
      while (store != (store *)0x0) {
        psVar3 = store->next;
        string_free(store->name);
        free_store(store);
        store = psVar3;
      }
      string_free(plVar1->towns[lVar4].code);
    }
    mem_free(plVar1->towns);
    string_free(plVar1->name);
    string_free(plVar1->help);
    mem_free(plVar1->levels);
    pplVar6 = &plVar1->next;
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_levels; i++) {
			struct level *level = &map->levels[i];
			string_free(level->north);
			string_free(level->east);
			string_free(level->south);
			string_free(level->west);
			string_free(level->up);
			string_free(level->down);
		}
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			struct store *store = town->stores, *next;
			while (store) {
				next = store->next;
				string_free((char *)store->name);
				free_store(store);
				store = next;
			}
			string_free(map->towns[i].code);
		}
		mem_free(map->towns);
		string_free(map->name);
		string_free(map->help);
		mem_free(map->levels);
		map = map->next;
	}
}